

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O2

int hugeRead(void *context,char *buffer,int len)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = rlen;
  pcVar2 = current;
  iVar1 = curseg;
  if (len < 0 || (buffer == (char *)0x0 || context == (void *)0x0)) {
    iVar4 = -1;
  }
  else {
    iVar5 = rlen - len;
    if (iVar5 == 0 || rlen < len) {
      if (curseg < 0x3e9) {
        memcpy(buffer,current,(long)rlen);
        curseg = iVar1 + 1;
        current = (&hugeDocParts->segment)[curseg == 1000];
        sVar3 = strlen(current);
        rlen = (int)sVar3;
      }
      else {
        rlen = 0;
        iVar4 = 0;
      }
    }
    else {
      memcpy(buffer,current,(ulong)(uint)len);
      current = pcVar2 + (uint)len;
      iVar4 = len;
      rlen = iVar5;
    }
  }
  return iVar4;
}

Assistant:

static int
hugeRead(void *context, char *buffer, int len)
{
    if ((context == NULL) || (buffer == NULL) || (len < 0))
        return (-1);

    if (len >= rlen) {
        if (curseg >= MAX_NODES + 1) {
            rlen = 0;
            return(0);
        }
        len = rlen;
        rlen = 0;
	memcpy(buffer, current, len);
        curseg ++;
        if (curseg == MAX_NODES) {
            current = hugeDocParts->finish;
	} else {
            current = hugeDocParts->segment;
	}
        rlen = strlen(current);
    } else {
	memcpy(buffer, current, len);
	rlen -= len;
        current += len;
    }
    return (len);
}